

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockd.c
# Opt level: O2

void av1_setup_block_planes(MACROBLOCKD *xd,int ss_x,int ss_y,int num_planes)

{
  int *piVar1;
  ulong uVar2;
  long lVar3;
  int iVar4;
  bool bVar5;
  
  uVar2 = 0;
  if (0 < num_planes) {
    uVar2 = (ulong)(uint)num_planes;
  }
  for (lVar3 = 0; uVar2 * 0xa30 - lVar3 != 0; lVar3 = lVar3 + 0xa30) {
    bVar5 = lVar3 != 0;
    *(bool *)((long)xd->plane[0].pre + lVar3 + -0x30) = bVar5;
    iVar4 = ss_x;
    if (!bVar5) {
      iVar4 = 0;
    }
    *(int *)((long)xd->plane[0].pre + lVar3 + -0x2c) = iVar4;
    iVar4 = ss_y;
    if (!bVar5) {
      iVar4 = 0;
    }
    *(int *)((long)xd->plane[0].pre + lVar3 + -0x28) = iVar4;
  }
  lVar3 = (long)num_planes;
  piVar1 = &xd->plane[lVar3].subsampling_y;
  for (; lVar3 < 3; lVar3 = lVar3 + 1) {
    *(undefined8 *)(piVar1 + -1) = 0x100000001;
    piVar1 = piVar1 + 0x28c;
  }
  return;
}

Assistant:

void av1_setup_block_planes(MACROBLOCKD *xd, int ss_x, int ss_y,
                            const int num_planes) {
  int i;

  for (i = 0; i < num_planes; i++) {
    xd->plane[i].plane_type = get_plane_type(i);
    xd->plane[i].subsampling_x = i ? ss_x : 0;
    xd->plane[i].subsampling_y = i ? ss_y : 0;
  }
  for (i = num_planes; i < MAX_MB_PLANE; i++) {
    xd->plane[i].subsampling_x = 1;
    xd->plane[i].subsampling_y = 1;
  }
}